

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O2

char * __thiscall DnsStats::GetZonePrefix(DnsStats *this,char *dnsName)

{
  uint uVar1;
  DnsPrefixEntry *pDVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  DnsPrefixEntry dpe;
  
  DnsPrefixEntry::DnsPrefixEntry(&dpe);
  if ((this->dnsPrefixTable).tableSize == 0) {
    LoadPrefixTable_from_memory(this);
  }
  if (dnsName != (char *)0x0) {
    uVar3 = 0xffffffff;
    uVar1 = 0;
    uVar4 = 0xffffffff;
    while (uVar5 = uVar1, dnsName[(int)uVar5] != '.') {
      dpe.hash = 0;
      dpe.dnsPrefix = dnsName + (int)uVar5;
      pDVar2 = BinHash<DnsPrefixEntry>::Retrieve(&this->dnsPrefixTable,&dpe);
      if (pDVar2 != (DnsPrefixEntry *)0x0) {
        pcVar6 = dnsName + (int)uVar5;
        if (pDVar2->dnsPrefixClass == DnsPrefixException) goto LAB_001668e9;
        if (pDVar2->dnsPrefixClass == DnsPrefixOneLevel) {
          if ((int)uVar3 < 0) break;
        }
        else {
          if ((int)uVar4 < 0) break;
          uVar3 = (ulong)uVar4;
        }
        pcVar6 = dnsName + uVar3;
        goto LAB_001668e9;
      }
      pcVar6 = dnsName + (int)uVar5;
      uVar1 = uVar5;
      while( true ) {
        uVar1 = uVar1 + 1;
        if (*pcVar6 == '\0') {
          pcVar6 = (char *)0x0;
          if (-1 < (int)uVar4) {
            pcVar6 = dnsName + uVar4;
          }
          goto LAB_001668e9;
        }
        if (*pcVar6 == '.') break;
        pcVar6 = pcVar6 + 1;
      }
      uVar3 = (ulong)uVar4;
      uVar4 = uVar5;
    }
  }
  pcVar6 = (char *)0x0;
LAB_001668e9:
  DnsPrefixEntry::~DnsPrefixEntry(&dpe);
  return pcVar6;
}

Assistant:

const char * DnsStats::GetZonePrefix(const char * dnsName)
{
    const char * ret = NULL;
    DnsPrefixEntry dpe;
    DnsPrefixEntry * retrieved;
    int prefixOffset = 0;
    int previousOffset = -1;
    int previousPreviousOffset = -1;

    if (dnsPrefixTable.GetSize() == 0) {
        LoadPrefixTable_from_memory();
    }

    while (ret == NULL && dnsName != NULL && dnsName[prefixOffset] != '.') {
        dpe.dnsPrefix = (char *)(dnsName + prefixOffset);
        dpe.hash = 0;

        if ((retrieved = dnsPrefixTable.Retrieve(&dpe)) != NULL)
        {
            switch (retrieved->dnsPrefixClass) {
            case DnsPrefixOneLevel:
                if (previousPreviousOffset >= 0) {
                    ret = dnsName + previousPreviousOffset;
                }
                break;
            case DnsPrefixException:
                ret = dnsName + prefixOffset;
                break;
            case DnsPrefixStd:
            default:
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            }
            break;
        } else {
            int offset = prefixOffset;

            while (dnsName[offset] != 0 && dnsName[offset] != '.') {
                offset++;
            }

            if (dnsName[offset] == 0) {
                if (previousOffset >= 0) {
                    ret = dnsName + previousOffset;
                }
                break;
            } else {
                previousPreviousOffset = previousOffset;
                previousOffset = prefixOffset;
                prefixOffset = offset + 1; /* Add 1 to skip the dot */
            }
        }
    }

    return ret;
}